

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioParse.c
# Opt level: O3

Vec_Int_t * Mio_ParseFormula(char *pFormInit,char **ppVarNames,int nVars)

{
  char cVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  size_t sVar5;
  byte *__s;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  size_t sVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  int iVar13;
  Vec_Int_t *pVVar14;
  Vec_Int_t *__ptr;
  char *pcVar15;
  long lVar16;
  long lVar17;
  byte *__ptr_00;
  Vec_Int_t *local_60;
  byte *local_58;
  Vec_Ptr_t *local_50;
  uint local_44;
  long local_40;
  char **local_38;
  
  iVar4 = 0;
  pcVar15 = pFormInit;
  do {
    cVar1 = *pcVar15;
    if (cVar1 == '(') {
      iVar4 = iVar4 + 1;
    }
    else if (cVar1 == ')') {
      iVar4 = iVar4 + -1;
    }
    else if (cVar1 == '\0') break;
    pcVar15 = pcVar15 + 1;
  } while( true );
  local_38 = ppVarNames;
  if (iVar4 != 0) {
    fwrite("Mio_ParseFormula(): Different number of opening and closing parentheses ().\n",0x4c,1,
           _stdout);
    return (Vec_Int_t *)0x0;
  }
  sVar5 = strlen(pFormInit);
  __s = (byte *)malloc(sVar5 + 3);
  sprintf((char *)__s,"(%s)",pFormInit);
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  local_50 = pVVar6;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  pVVar14 = (Vec_Int_t *)0x190;
  piVar9 = (int *)malloc(400);
  pVVar8->pArray = piVar9;
  local_40 = (ulong)(uint)nVars * 2;
  iVar4 = 1;
  local_60 = pVVar8;
  local_58 = __s;
LAB_008b738c:
  pVVar6 = local_50;
  __ptr_00 = local_58;
  pVVar8 = local_60;
  bVar3 = *__s;
  if (bVar3 < 0x20) {
    if ((bVar3 - 9 < 2) || (bVar3 == 0xd)) goto switchD_008b73ae_caseD_20;
    if (bVar3 != 0) goto switchD_008b73ae_caseD_22;
    if (local_50->nSize == 0) {
      pcVar15 = "Mio_ParseFormula(): The input string is empty\n";
      sVar5 = 0x2e;
    }
    else {
      pVVar14 = (Vec_Int_t *)Vec_PtrPop(local_50);
      if (pVVar6->nSize == 0) {
        if (local_60->nSize == 0) {
          if (__ptr_00 != (byte *)0x0) {
            free(__ptr_00);
          }
          Vec_PtrFreeP(&local_50);
          Vec_IntFreeP(&local_60);
          Exp_Reverse(pVVar14);
          return pVVar14;
        }
        pcVar15 = "Mio_ParseFormula(): Something is left in the operation stack\n";
        sVar5 = 0x3d;
      }
      else {
        pcVar15 = "Mio_ParseFormula(): Something is left in the function stack\n";
        sVar5 = 0x3c;
      }
    }
    fwrite(pcVar15,sVar5,1,_stdout);
    goto LAB_008b7b82;
  }
  switch(bVar3) {
  case 0x20:
    goto switchD_008b73ae_caseD_20;
  case 0x21:
    if (iVar4 != 2) {
      pVVar14 = local_60;
      Vec_IntPush(local_60,10);
      if (iVar4 != 1) goto LAB_008b7709;
      iVar4 = 1;
      goto switchD_008b73ae_caseD_20;
    }
    Vec_IntPush(local_60,9);
    iVar4 = 10;
    goto LAB_008b76fe;
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
switchD_008b73ae_caseD_22:
    lVar16 = -0x100000000;
    sVar5 = 0;
    do {
      if (bVar3 < 0x2c) {
        if ((0xec100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0) goto LAB_008b767a;
        if ((0x10200000000U >> ((ulong)bVar3 & 0x3f) & 1) != 0) {
          fwrite("Mio_ParseFormula(): The negation sign or an opening parenthesis inside the variable name.\n"
                 ,0x5a,1,_stdout);
          local_44 = 0;
          goto LAB_008b7684;
        }
      }
      if ((bVar3 == 0x5e) || (bVar3 == 0x7c)) goto LAB_008b767a;
      bVar3 = __s[sVar5 + 1];
      sVar5 = sVar5 + 1;
      lVar16 = lVar16 + 0x100000000;
    } while( true );
  case 0x26:
  case 0x2a:
  case 0x2b:
    goto switchD_008b73ae_caseD_26;
  case 0x27:
    if (iVar4 != 2) {
      pcVar15 = "Mio_ParseFormula(): No variable is specified before the negation suffix.\n";
      sVar5 = 0x49;
      goto LAB_008b7b73;
    }
    if (local_50->nSize < 1) {
LAB_008b7c7c:
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x2d2,"void *Vec_PtrPop(Vec_Ptr_t *)");
    }
    pVVar11 = (Vec_Int_t *)local_50->pArray;
    uVar12 = local_50->nSize - 1;
    local_50->nSize = uVar12;
    pVVar8 = *(Vec_Int_t **)(&pVVar11->nCap + (ulong)uVar12 * 2);
    if (pVVar8->nSize < 1) {
LAB_008b7c9b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    *pVVar8->pArray = *pVVar8->pArray ^ 1;
    piVar9 = &local_50->nSize;
    uVar12 = local_50->nSize;
    if (uVar12 == local_50->nCap) {
      pVVar14 = pVVar11;
      if ((int)uVar12 < 0x10) {
        pVVar11 = (Vec_Int_t *)realloc(pVVar11,0x80);
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar12 * 2;
        pVVar11 = (Vec_Int_t *)realloc(pVVar11,(ulong)uVar12 << 4);
      }
      pVVar6->pArray = (void **)pVVar11;
      pVVar6->nCap = iVar4;
    }
    goto LAB_008b795b;
  case 0x28:
    if (iVar4 == 2) {
      Vec_IntPush(local_60,9);
    }
    iVar4 = 1;
    iVar13 = 1;
    goto LAB_008b7777;
  case 0x29:
    iVar4 = local_60->nSize;
    while( true ) {
      if (iVar4 == 0) {
        pcVar15 = "Mio_ParseFormula(): There is no opening parenthesis\n";
        sVar5 = 0x34;
        goto LAB_008b7b73;
      }
      if (iVar4 < 1) goto LAB_008b7c5d;
      pVVar8->nSize = iVar4 - 1U;
      if (pVVar8->pArray[iVar4 - 1U] == 1) break;
      pVVar11 = Mio_ParseFormulaOper(&pVVar14->nCap,nVars,pVVar6,pVVar8->pArray[iVar4 - 1U]);
      if (pVVar11 == (Vec_Int_t *)0x0) goto LAB_008b7a2b;
      iVar4 = pVVar8->nSize;
    }
    break;
  case 0x30:
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 0x10;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(0x40);
    pVVar8->pArray = piVar9;
    pVVar14 = pVVar8;
    Vec_IntPush(pVVar8,-1);
    uVar12 = pVVar6->nSize;
    if (uVar12 == pVVar6->nCap) {
      if ((int)uVar12 < 0x10) {
        pVVar14 = (Vec_Int_t *)pVVar6->pArray;
        if (pVVar14 == (Vec_Int_t *)0x0) {
          pVVar14 = (Vec_Int_t *)0x80;
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(pVVar14,0x80);
        }
        pVVar6->pArray = ppvVar7;
        pVVar6->nCap = 0x10;
      }
      else {
        pVVar11 = (Vec_Int_t *)pVVar6->pArray;
        pVVar14 = (Vec_Int_t *)((ulong)uVar12 << 4);
        if (pVVar11 == (Vec_Int_t *)0x0) {
          ppvVar7 = (void **)malloc((size_t)pVVar14);
        }
        else {
          ppvVar7 = (void **)realloc(pVVar11,(size_t)pVVar14);
          pVVar14 = pVVar11;
        }
        pVVar6->pArray = ppvVar7;
        pVVar6->nCap = uVar12 * 2;
      }
    }
    else {
      ppvVar7 = pVVar6->pArray;
    }
    iVar13 = pVVar6->nSize;
    pVVar6->nSize = iVar13 + 1;
    ppvVar7[iVar13] = pVVar8;
    if (iVar4 == 2) {
      pcVar15 = "Mio_ParseFormula(): No operation symbol before constant 0.\n";
LAB_008b7b15:
      sVar5 = 0x3b;
      goto LAB_008b7b73;
    }
    break;
  case 0x31:
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    pVVar8->nCap = 0x10;
    pVVar8->nSize = 0;
    piVar9 = (int *)malloc(0x40);
    pVVar8->pArray = piVar9;
    pVVar14 = pVVar8;
    Vec_IntPush(pVVar8,-2);
    uVar12 = pVVar6->nSize;
    if (uVar12 == pVVar6->nCap) {
      if ((int)uVar12 < 0x10) {
        pVVar14 = (Vec_Int_t *)pVVar6->pArray;
        if (pVVar14 == (Vec_Int_t *)0x0) {
          pVVar14 = (Vec_Int_t *)0x80;
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(pVVar14,0x80);
        }
        pVVar6->pArray = ppvVar7;
        pVVar6->nCap = 0x10;
      }
      else {
        pVVar11 = (Vec_Int_t *)pVVar6->pArray;
        pVVar14 = (Vec_Int_t *)((ulong)uVar12 << 4);
        if (pVVar11 == (Vec_Int_t *)0x0) {
          ppvVar7 = (void **)malloc((size_t)pVVar14);
        }
        else {
          ppvVar7 = (void **)realloc(pVVar11,(size_t)pVVar14);
          pVVar14 = pVVar11;
        }
        pVVar6->pArray = ppvVar7;
        pVVar6->nCap = uVar12 * 2;
      }
    }
    else {
      ppvVar7 = pVVar6->pArray;
    }
    iVar13 = pVVar6->nSize;
    pVVar6->nSize = iVar13 + 1;
    ppvVar7[iVar13] = pVVar8;
    if (iVar4 == 2) {
      pcVar15 = "Mio_ParseFormula(): No operation symbol before constant 1.\n";
      goto LAB_008b7b15;
    }
    break;
  default:
    if ((bVar3 != 0x5e) && (bVar3 != 0x7c)) goto switchD_008b73ae_caseD_22;
switchD_008b73ae_caseD_26:
    if (iVar4 == 2) {
      if (bVar3 < 0x2b) {
        if ((bVar3 == 0x26) || (bVar3 == 0x2a)) {
          iVar4 = 9;
        }
        else {
LAB_008b76cb:
          iVar4 = 8;
        }
      }
      else {
        if ((bVar3 != 0x2b) && (bVar3 != 0x7c)) goto LAB_008b76cb;
        iVar4 = 7;
      }
LAB_008b76fe:
      Vec_IntPush(pVVar8,iVar4);
      iVar4 = 3;
      pVVar14 = pVVar8;
LAB_008b7709:
      pVVar6 = local_50;
      pVVar8 = local_60;
      iVar2 = local_60->nSize;
      do {
        if (iVar2 < 1) {
LAB_008b7c5d:
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
        }
        uVar12 = iVar2 - 1;
        pVVar8->nSize = uVar12;
        iVar13 = pVVar8->pArray[uVar12];
        if (uVar12 == 0) goto LAB_008b7777;
        pVVar8->nSize = iVar2 - 2U;
        iVar2 = pVVar8->pArray[iVar2 - 2U];
        if (iVar2 < iVar13) goto LAB_008b7768;
        pVVar14 = Mio_ParseFormulaOper(&pVVar14->nCap,nVars,pVVar6,iVar2);
        if (pVVar14 == (Vec_Int_t *)0x0) goto LAB_008b7a2b;
        pVVar14 = pVVar8;
        Vec_IntPush(pVVar8,iVar13);
        iVar2 = pVVar8->nSize;
      } while( true );
    }
    pcVar15 = "Mio_ParseFormula(): There is no variable before AND, EXOR, or OR.\n";
    sVar5 = 0x42;
LAB_008b7b73:
    fwrite(pcVar15,sVar5,1,_stdout);
    __ptr_00 = local_58;
    goto LAB_008b7b82;
  }
  goto LAB_008b7967;
LAB_008b767a:
  local_44 = (uint)(iVar4 == 2);
LAB_008b7684:
  if (nVars < 1) {
LAB_008b7a9b:
    fprintf(_stdout,"Mio_ParseFormula(): The parser cannot find var \"%s\" in the input var list.\n"
            ,__s);
    __ptr_00 = local_58;
LAB_008b7b82:
    if (__ptr_00 != (byte *)0x0) {
      free(__ptr_00);
    }
    pVVar6 = local_50;
    if (local_50 != (Vec_Ptr_t *)0x0) {
      if (local_50->pArray != (void **)0x0) {
        free(local_50->pArray);
      }
      free(pVVar6);
    }
    pVVar8 = local_60;
    if (local_60 == (Vec_Int_t *)0x0) {
      return (Vec_Int_t *)0x0;
    }
    if (local_60->pArray != (int *)0x0) {
      free(local_60->pArray);
    }
    goto LAB_008b7bca;
  }
  lVar17 = 0;
  while( true ) {
    pcVar15 = *(char **)((long)local_38 + lVar17 * 4);
    iVar4 = strncmp((char *)__s,pcVar15,sVar5);
    if ((iVar4 == 0) && (sVar10 = strlen(pcVar15), sVar10 == sVar5)) break;
    lVar17 = lVar17 + 2;
    if (local_40 == lVar17) goto LAB_008b7a9b;
  }
  if ((char)local_44 != '\0') {
    Vec_IntPush(local_60,9);
  }
  pVVar6 = local_50;
  __s = __s + (lVar16 >> 0x20);
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 0x10;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(0x40);
  pVVar8->pArray = piVar9;
  pVVar14 = pVVar8;
  Vec_IntPush(pVVar8,(int)lVar17);
  piVar9 = &pVVar6->nSize;
  uVar12 = pVVar6->nSize;
  if (uVar12 == pVVar6->nCap) {
    if ((int)uVar12 < 0x10) {
      pVVar14 = (Vec_Int_t *)pVVar6->pArray;
      if (pVVar14 == (Vec_Int_t *)0x0) {
        pVVar14 = (Vec_Int_t *)0x80;
        pVVar11 = (Vec_Int_t *)malloc(0x80);
      }
      else {
        pVVar11 = (Vec_Int_t *)realloc(pVVar14,0x80);
      }
      pVVar6->pArray = (void **)pVVar11;
      pVVar6->nCap = 0x10;
    }
    else {
      __ptr = (Vec_Int_t *)pVVar6->pArray;
      pVVar14 = (Vec_Int_t *)((ulong)uVar12 << 4);
      if (__ptr == (Vec_Int_t *)0x0) {
        pVVar11 = (Vec_Int_t *)malloc((size_t)pVVar14);
      }
      else {
        pVVar11 = (Vec_Int_t *)realloc(__ptr,(size_t)pVVar14);
        pVVar14 = __ptr;
      }
      pVVar6->pArray = (void **)pVVar11;
      pVVar6->nCap = uVar12 * 2;
    }
  }
  else {
    pVVar11 = (Vec_Int_t *)pVVar6->pArray;
  }
LAB_008b795b:
  iVar4 = *piVar9;
  *piVar9 = iVar4 + 1;
  *(Vec_Int_t **)(&pVVar11->nCap + (long)iVar4 * 2) = pVVar8;
LAB_008b7967:
  pVVar6 = local_50;
  pVVar8 = local_60;
  iVar4 = local_60->nSize;
  while (iVar4 != 0) {
    if (iVar4 < 1) goto LAB_008b7c5d;
    pVVar8->nSize = iVar4 - 1U;
    if (pVVar8->pArray[iVar4 - 1U] != 10) {
      Vec_IntPush(pVVar8,pVVar8->pArray[iVar4 - 1U]);
      pVVar14 = pVVar8;
      break;
    }
    if (pVVar6->nSize < 1) goto LAB_008b7c7c;
    pVVar11 = (Vec_Int_t *)pVVar6->pArray;
    uVar12 = pVVar6->nSize - 1;
    pVVar6->nSize = uVar12;
    lVar16 = *(long *)(&pVVar11->nCap + (ulong)uVar12 * 2);
    if (*(int *)(lVar16 + 4) < 1) goto LAB_008b7c9b;
    **(uint **)(lVar16 + 8) = **(uint **)(lVar16 + 8) ^ 1;
    uVar12 = pVVar6->nSize;
    if (uVar12 == pVVar6->nCap) {
      pVVar14 = pVVar11;
      if ((int)uVar12 < 0x10) {
        pVVar11 = (Vec_Int_t *)realloc(pVVar11,0x80);
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar12 * 2;
        pVVar11 = (Vec_Int_t *)realloc(pVVar11,(ulong)uVar12 << 4);
      }
      pVVar6->pArray = (void **)pVVar11;
      pVVar6->nCap = iVar4;
    }
    iVar4 = pVVar6->nSize;
    pVVar6->nSize = iVar4 + 1;
    *(long *)(&pVVar11->nCap + (long)iVar4 * 2) = lVar16;
    iVar4 = pVVar8->nSize;
  }
  iVar4 = 2;
  goto switchD_008b73ae_caseD_20;
LAB_008b7768:
  Vec_IntPush(pVVar8,iVar2);
LAB_008b7777:
  Vec_IntPush(pVVar8,iVar13);
  pVVar14 = pVVar8;
switchD_008b73ae_caseD_20:
  __s = __s + 1;
  goto LAB_008b738c;
LAB_008b7a2b:
  fwrite("Mio_ParseFormula(): Unknown operation\n",0x26,1,_stdout);
  if (local_58 != (byte *)0x0) {
    free(local_58);
  }
  if (pVVar6 != (Vec_Ptr_t *)0x0) {
    if (pVVar6->pArray != (void **)0x0) {
      free(pVVar6->pArray);
      pVVar6->pArray = (void **)0x0;
    }
    free(pVVar6);
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
LAB_008b7bca:
  free(pVVar8);
  return (Vec_Int_t *)0x0;
}

Assistant:

Vec_Int_t * Mio_ParseFormula( char * pFormInit, char ** ppVarNames, int nVars )
{
    char * pFormula;
    int Man = nVars, * pMan = &Man;
    Vec_Ptr_t * pStackFn;
    Vec_Int_t * pStackOp;
    Vec_Int_t * gFunc;
    char * pTemp, * pName;
    int nParans, fFound, Flag;
    int Oper, Oper1, Oper2;
    int i, v;

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormInit; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        fprintf( stdout, "Mio_ParseFormula(): Different number of opening and closing parentheses ().\n" );
        return NULL;
    }

    // copy the formula
    pFormula = ABC_ALLOC( char, strlen(pFormInit) + 3 );
    sprintf( pFormula, "(%s)", pFormInit );

    // start the stacks
    pStackFn = Vec_PtrAlloc( 100 );
    pStackOp = Vec_IntAlloc( 100 );

    Flag = MIO_EQN_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
    {
        switch ( *pTemp )
        {
        // skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
            continue;
        case MIO_EQN_SYM_CONST0:
            Vec_PtrPush( pStackFn, Exp_Const0() );  // Cudd_Ref( b0 );
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): No operation symbol before constant 0.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        case MIO_EQN_SYM_CONST1:
            Vec_PtrPush( pStackFn, Exp_Const1() );  //  Cudd_Ref( b1 );
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): No operation symbol before constant 1.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        case MIO_EQN_SYM_NEG:
            if ( Flag == MIO_EQN_FLAG_VAR )
            {// if NEGBEF follows a variable, AND is assumed
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
                Flag = MIO_EQN_FLAG_OPER;
            }
            Vec_IntPush( pStackOp, MIO_EQN_OPER_NEG );
            break;
        case MIO_EQN_SYM_NEGAFT:
            if ( Flag != MIO_EQN_FLAG_VAR )
            {// if there is no variable before NEGAFT, it is an error
                fprintf( stdout, "Mio_ParseFormula(): No variable is specified before the negation suffix.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            else // if ( Flag == PARSE_FLAG_VAR )
                Vec_PtrPush( pStackFn, Exp_Not( (Vec_Int_t *)Vec_PtrPop(pStackFn) ) );
            break;
        case MIO_EQN_SYM_AND:
        case MIO_EQN_SYM_AND2:
        case MIO_EQN_SYM_OR:
        case MIO_EQN_SYM_OR2:
        case MIO_EQN_SYM_XOR:
            if ( Flag != MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): There is no variable before AND, EXOR, or OR.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            if ( *pTemp == MIO_EQN_SYM_AND || *pTemp == MIO_EQN_SYM_AND2 )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
            else if ( *pTemp == MIO_EQN_SYM_OR || *pTemp == MIO_EQN_SYM_OR2 )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_OR );
            else //if ( *pTemp == MIO_EQN_SYM_XOR )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_XOR );
            Flag = MIO_EQN_FLAG_OPER; 
            break;
        case MIO_EQN_SYM_OPEN:
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
//                fprintf( stdout, "Mio_ParseFormula(): An opening parenthesis follows a var without operation sign.\n" ); 
//                Flag = MIO_EQN_FLAG_ERROR; 
//              break; 
            }
            Vec_IntPush( pStackOp, MIO_EQN_OPER_MARK );
            // after an opening bracket, it feels like starting over again
            Flag = MIO_EQN_FLAG_START; 
            break;
        case MIO_EQN_SYM_CLOSE:
            if ( Vec_IntSize( pStackOp ) != 0 )
            {
                while ( 1 )
                {
                    if ( Vec_IntSize( pStackOp ) == 0 )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): There is no opening parenthesis\n" );
                        Flag = MIO_EQN_FLAG_ERROR; 
                        break;
                    }
                    Oper = Vec_IntPop( pStackOp );
                    if ( Oper == MIO_EQN_OPER_MARK )
                        break;

                    // perform the given operation
                    if ( Mio_ParseFormulaOper( pMan, nVars, pStackFn, Oper ) == NULL )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Vec_PtrFreeP( &pStackFn );
                        Vec_IntFreeP( &pStackOp );
                        return NULL;
                    }
                }
            }
            else
            {
                fprintf( stdout, "Mio_ParseFormula(): There is no opening parenthesis\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            if ( Flag != MIO_EQN_FLAG_ERROR )
                Flag = MIO_EQN_FLAG_VAR; 
            break;


        default:
            // scan the next name
            for ( i = 0; pTemp[i] && 
                         pTemp[i] != ' ' && pTemp[i] != '\t' && pTemp[i] != '\r' && pTemp[i] != '\n' &&
                         pTemp[i] != MIO_EQN_SYM_AND && pTemp[i] != MIO_EQN_SYM_AND2 && pTemp[i] != MIO_EQN_SYM_OR && pTemp[i] != MIO_EQN_SYM_OR2 && 
                         pTemp[i] != MIO_EQN_SYM_XOR && pTemp[i] != MIO_EQN_SYM_NEGAFT && pTemp[i] != MIO_EQN_SYM_CLOSE; 
                  i++ )
              {
                    if ( pTemp[i] == MIO_EQN_SYM_NEG || pTemp[i] == MIO_EQN_SYM_OPEN )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): The negation sign or an opening parenthesis inside the variable name.\n" );
                        Flag = MIO_EQN_FLAG_ERROR; 
                        break;
                    }
              }
            // variable name is found
            fFound = 0;
//            Vec_PtrForEachEntry( char *, vVarNames, pName, v )
            for ( v = 0; v < nVars; v++ )
            {
                pName = ppVarNames[v];
                if ( strncmp(pTemp, pName, i) == 0 && strlen(pName) == (unsigned)i )
                {
                    pTemp += i-1;
                    fFound = 1;
                    break;
                }
            }
            if ( !fFound )
            { 
                fprintf( stdout, "Mio_ParseFormula(): The parser cannot find var \"%s\" in the input var list.\n", pTemp ); 
                Flag = MIO_EQN_FLAG_ERROR; 
                break; 
            }
/*
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): The variable name \"%s\" follows another var without operation sign.\n", pTemp ); 
                Flag = MIO_EQN_FLAG_ERROR; 
                break; 
            }
*/
            if ( Flag == MIO_EQN_FLAG_VAR )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );

            Vec_PtrPush( pStackFn, Exp_Var(v) ); // Cudd_Ref( pbVars[v] );
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        }

        if ( Flag == MIO_EQN_FLAG_ERROR )
            break;      // error exit
        else if ( Flag == MIO_EQN_FLAG_START )
            continue;  //  go on parsing
        else if ( Flag == MIO_EQN_FLAG_VAR )
            while ( 1 )
            {  // check if there are negations in the OpStack     
                if ( Vec_IntSize( pStackOp ) == 0 )
                    break;
                Oper = Vec_IntPop( pStackOp );
                if ( Oper != MIO_EQN_OPER_NEG )
                {
                    Vec_IntPush( pStackOp, Oper );
                    break;
                }
                else
                {
                      Vec_PtrPush( pStackFn, Exp_Not((Vec_Int_t *)Vec_PtrPop(pStackFn)) );
                }
            }
        else // if ( Flag == MIO_EQN_FLAG_OPER )
            while ( 1 )
            {  // execute all the operations in the OpStack
               // with precedence higher or equal than the last one
                Oper1 = Vec_IntPop( pStackOp ); // the last operation
                if ( Vec_IntSize( pStackOp ) == 0 ) 
                {  // if it is the only operation, push it back
                    Vec_IntPush( pStackOp, Oper1 );
                    break;
                }
                Oper2 = Vec_IntPop( pStackOp ); // the operation before the last one
                if ( Oper2 >= Oper1 )  
                {  // if Oper2 precedence is higher or equal, execute it
                    if ( Mio_ParseFormulaOper( pMan, nVars, pStackFn, Oper2 ) == NULL )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Vec_PtrFreeP( &pStackFn );
                        Vec_IntFreeP( &pStackOp );
                        return NULL;
                    }
                    Vec_IntPush( pStackOp,  Oper1 );     // push the last operation back
                }
                else
                {  // if Oper2 precedence is lower, push them back and done
                    Vec_IntPush( pStackOp, Oper2 );
                    Vec_IntPush( pStackOp, Oper1 );
                    break;
                }
            }
    }

    if ( Flag != MIO_EQN_FLAG_ERROR )
    {
        if ( Vec_PtrSize(pStackFn) != 0 )
        {    
            gFunc = (Vec_Int_t *)Vec_PtrPop(pStackFn);
            if ( Vec_PtrSize(pStackFn) == 0 )
                if ( Vec_IntSize( pStackOp ) == 0 )
                {
//                    Cudd_Deref( gFunc );
                    ABC_FREE( pFormula );
                    Vec_PtrFreeP( &pStackFn );
                    Vec_IntFreeP( &pStackOp );
                    return Exp_Reverse(gFunc);
                }
                else
                    fprintf( stdout, "Mio_ParseFormula(): Something is left in the operation stack\n" );
            else
                fprintf( stdout, "Mio_ParseFormula(): Something is left in the function stack\n" );
        }
        else
            fprintf( stdout, "Mio_ParseFormula(): The input string is empty\n" );
    }
    ABC_FREE( pFormula );
    Vec_PtrFreeP( &pStackFn );
    Vec_IntFreeP( &pStackOp );
    return NULL;
}